

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSat.c
# Opt level: O2

int Fra_NodesAreImp(Fra_Man_t *p,Aig_Obj_t *pOld,Aig_Obj_t *pNew,int fComplL,int fComplR)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  sat_solver *psVar4;
  abctime aVar5;
  abctime aVar6;
  long lVar7;
  undefined8 local_48;
  lit local_40 [2];
  long local_38;
  
  if (((ulong)pNew & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSat.c"
                  ,0xd8,"int Fra_NodesAreImp(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)");
  }
  if (((ulong)pOld & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSat.c"
                  ,0xd9,"int Fra_NodesAreImp(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)");
  }
  if (pNew == pOld) {
    __assert_fail("pNew != pOld",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSat.c"
                  ,0xda,"int Fra_NodesAreImp(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)");
  }
  lVar7 = (long)p->pPars->nBTLimitNode;
  p->nSatCalls = p->nSatCalls + 1;
  if (p->pSat == (sat_solver *)0x0) {
    psVar4 = sat_solver_new();
    p->pSat = psVar4;
    p->nSatVars = 1;
    sat_solver_setnvars(psVar4,1000);
    local_48 = (ulong)local_48._4_4_ << 0x20;
    sat_solver_addclause(p->pSat,(lit *)&local_48,(lit *)((long)&local_48 + 4));
  }
  Fra_CnfNodeAddToSolver(p,pOld,pNew);
  psVar4 = p->pSat;
  if (psVar4->qtail != psVar4->qhead) {
    iVar2 = sat_solver_simplify(psVar4);
    if (iVar2 == 0) {
      __assert_fail("status != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSat.c"
                    ,0xfe,"int Fra_NodesAreImp(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)");
    }
    if (p->pSat->qtail != p->pSat->qhead) {
      __assert_fail("p->pSat->qtail == p->pSat->qhead",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSat.c"
                    ,0xff,"int Fra_NodesAreImp(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)");
    }
  }
  local_38 = lVar7;
  if (p->pPars->fConeBias != 0) {
    Fra_SetActivityFactors(p,pOld,pNew);
  }
  aVar5 = Abc_Clock();
  local_48 = CONCAT44((uint)(fComplR == 0) +
                      *(int *)(*(long *)((long)(pNew->field_5).pData + 0x98) + (long)pNew->Id * 4) *
                      2,(uint)(fComplL != 0) +
                        *(int *)(*(long *)((long)(pOld->field_5).pData + 0x98) + (long)pOld->Id * 4)
                        * 2);
  iVar2 = 0;
  iVar3 = sat_solver_solve(p->pSat,(lit *)&local_48,local_40,local_38,0,p->nBTLimitGlobal,
                           p->nInsLimitGlobal);
  aVar6 = Abc_Clock();
  p->timeSat = p->timeSat + (aVar6 - aVar5);
  aVar6 = Abc_Clock();
  lVar7 = aVar6 - aVar5;
  if (iVar3 == 1) {
    p->timeSatSat = p->timeSatSat + lVar7;
    Fra_SmlSavePattern(p);
    lVar7 = 0xd4;
  }
  else if (iVar3 == -1) {
    p->timeSatUnsat = p->timeSatUnsat + lVar7;
    local_48 = local_48 ^ 0x100000001;
    iVar2 = sat_solver_addclause(p->pSat,(lit *)&local_48,local_40);
    if (iVar2 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSat.c"
                    ,0x118,"int Fra_NodesAreImp(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)");
    }
    p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
    iVar2 = 1;
    lVar7 = 0xdc;
  }
  else {
    p->timeSatFail = p->timeSatFail + lVar7;
    if (p->pManFraig->pConst1 != pOld) {
      pOld->field_0x18 = pOld->field_0x18 | 0x20;
    }
    pNew->field_0x18 = pNew->field_0x18 | 0x20;
    iVar2 = -1;
    lVar7 = 0xe4;
  }
  piVar1 = (int *)((long)&p->pPars + lVar7);
  *piVar1 = *piVar1 + 1;
  return iVar2;
}

Assistant:

int Fra_NodesAreImp( Fra_Man_t * p, Aig_Obj_t * pOld, Aig_Obj_t * pNew, int fComplL, int fComplR )
{
    int pLits[4], RetValue, RetValue1, nBTLimit;
    abctime clk;//, clk2 = Abc_Clock();
    int status;

    // make sure the nodes are not complemented
    assert( !Aig_IsComplement(pNew) );
    assert( !Aig_IsComplement(pOld) );
    assert( pNew != pOld );

    // if at least one of the nodes is a failed node, perform adjustments:
    // if the backtrack limit is small, simply skip this node
    // if the backtrack limit is > 10, take the quare root of the limit
    nBTLimit = p->pPars->nBTLimitNode;
/*
    if ( !p->pPars->fSpeculate && p->pPars->nFramesK == 0 && (nBTLimit > 0 && (pOld->fMarkB || pNew->fMarkB)) )
    {
        p->nSatFails++;
        // fail immediately
//        return -1;
        if ( nBTLimit <= 10 )
            return -1;
        nBTLimit = (int)pow(nBTLimit, 0.7);
    }
*/
    p->nSatCalls++;

    // make sure the solver is allocated and has enough variables
    if ( p->pSat == NULL )
    {
        p->pSat = sat_solver_new();
        p->nSatVars = 1;
        sat_solver_setnvars( p->pSat, 1000 );
        // var 0 is reserved for const1 node - add the clause
        pLits[0] = toLit( 0 );
        sat_solver_addclause( p->pSat, pLits, pLits + 1 );
    }

    // if the nodes do not have SAT variables, allocate them
    Fra_CnfNodeAddToSolver( p, pOld, pNew );

    if ( p->pSat->qtail != p->pSat->qhead )
    {
        status = sat_solver_simplify(p->pSat);
        assert( status != 0 );
        assert( p->pSat->qtail == p->pSat->qhead );
    }

    // prepare variable activity
    if ( p->pPars->fConeBias )
        Fra_SetActivityFactors( p, pOld, pNew ); 

    // solve under assumptions
    // A = 1; B = 0     OR     A = 1; B = 1 
clk = Abc_Clock();
//    pLits[0] = toLitCond( Fra_ObjSatNum(pOld), 0 );
//    pLits[1] = toLitCond( Fra_ObjSatNum(pNew), pOld->fPhase == pNew->fPhase );
    pLits[0] = toLitCond( Fra_ObjSatNum(pOld),  fComplL );
    pLits[1] = toLitCond( Fra_ObjSatNum(pNew), !fComplR );
//Sat_SolverWriteDimacs( p->pSat, "temp.cnf", pLits, pLits + 2, 1 );
    RetValue1 = sat_solver_solve( p->pSat, pLits, pLits + 2, 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, 
        p->nBTLimitGlobal, p->nInsLimitGlobal );
p->timeSat += Abc_Clock() - clk;
    if ( RetValue1 == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        pLits[0] = lit_neg( pLits[0] );
        pLits[1] = lit_neg( pLits[1] );
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
        // continue solving the other implication
        p->nSatCallsUnsat++;
    }
    else if ( RetValue1 == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        Fra_SmlSavePattern( p );
        p->nSatCallsSat++;
        return 0;
    }
    else // if ( RetValue1 == l_Undef )
    {
p->timeSatFail += Abc_Clock() - clk;
        // mark the node as the failed node
        if ( pOld != p->pManFraig->pConst1 ) 
            pOld->fMarkB = 1;
        pNew->fMarkB = 1;
        p->nSatFailsReal++;
        return -1;
    }
    // return SAT proof
    p->nSatProof++;
    return 1;
}